

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# descriptor.cc
# Opt level: O2

void __thiscall
google::protobuf::DescriptorBuilder::ValidateJSType
          (DescriptorBuilder *this,FieldDescriptor *field,FieldDescriptorProto *proto)

{
  uint uVar1;
  long lVar2;
  Type TVar3;
  EnumDescriptor *pEVar4;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_40;
  
  uVar1 = *(uint *)(*(long *)(field + 0x38) + 0x50);
  if ((long)(int)uVar1 != 0) {
    TVar3 = FieldDescriptor::type(field);
    if ((MAX_TYPE < TVar3) || ((0x50058U >> (TVar3 & (TYPE_SFIXED64|TYPE_SFIXED32)) & 1) == 0)) {
      AddError(this,(string *)(*(long *)(field + 8) + 0x20),&proto->super_Message,TYPE,
               "jstype is only allowed on int64, uint64, sint64, fixed64 or sfixed64 fields.");
      return;
    }
    if (2 < uVar1) {
      lVar2 = *(long *)(field + 8);
      pEVar4 = FieldOptions_JSType_descriptor();
      std::operator+(&local_40,
                     "Illegal jstype for int64, uint64, sint64, fixed64 or sfixed64 field: ",
                     *(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> **)
                      (*(long *)(pEVar4 + 0x28) + 8 + (long)(int)uVar1 * 0x20));
      AddError(this,(string *)(lVar2 + 0x20),&proto->super_Message,TYPE,&local_40);
      std::__cxx11::string::~string((string *)&local_40);
    }
  }
  return;
}

Assistant:

const ServiceDescriptor* DescriptorPool::FindServiceByName(
    ConstStringParam name) const {
  return tables_->FindByNameHelper(this, name).service_descriptor();
}